

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceRenderTimeCase::init
          (ReferenceRenderTimeCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  int numBytes;
  int numBytes_00;
  char *local_1f8;
  string local_1f0;
  string local_1d0;
  int local_1b0;
  int local_1ac;
  int local_1a8 [4];
  MessageBuilder local_198;
  char *local_18;
  char *targetFunctionName;
  ReferenceRenderTimeCase *this_local;
  
  local_18 = "Draw method: drawElements";
  if ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    local_18 = "Draw method: drawArrays";
  }
  local_18 = local_18 + 0xd;
  targetFunctionName = (char *)this;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::init
            (&this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,
             ctx);
  this_00 = tcu::TestContext::getLog
                      ((this->
                       super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                       ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [28])"Measuring the time used in ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_18);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [58])
                             " and readPixels call with different rendering workloads.\n");
  local_1a8[0] = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
                 getNumSamples(&this->
                                super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                              );
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1a8);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [44])" test samples. Sample order is randomized.\n");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [87])0x2bdd6c9);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [123])
                             "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
                     );
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [34])"Workload sizes are in the range [");
  local_1ac = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
              getMinWorkloadSize(&this->
                                  super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                                );
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1ac);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])",  ");
  local_1b0 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
              getMaxWorkloadSize(&this->
                                  super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                                );
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1b0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])"] vertices ([");
  uVar1 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMinWorkloadDataSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)(ulong)uVar1,numBytes);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c6b075);
  uVar1 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMaxWorkloadDataSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)uVar1,numBytes_00);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1f0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [21])"] to be processed).\n");
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [67])
                             "Test result is the approximated total processing rate in MiB / s.\n");
  local_1f8 = "";
  if ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    local_1f8 = "Note that index array size is not included in the processed size.\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1f8);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [114])
                             "Note! Test result should only be used as a baseline reference result for buffer.data_upload.* test group results."
                     );
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return extraout_EAX;
}

Assistant:

void ReferenceRenderTimeCase::init (void)
{
	const char* const targetFunctionName = (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");

	// init parent
	RenderCase<RenderReadDuration>::init();

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Measuring the time used in " << targetFunctionName << " and readPixels call with different rendering workloads.\n"
		<< getNumSamples() << " test samples. Sample order is randomized.\n"
		<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
		<< "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
		<< "Workload sizes are in the range ["
			<< getMinWorkloadSize() << ",  "
			<< getMaxWorkloadSize() << "] vertices (["
			<< getHumanReadableByteSize(getMinWorkloadDataSize()) << ","
			<< getHumanReadableByteSize(getMaxWorkloadDataSize()) << "] to be processed).\n"
		<< "Test result is the approximated total processing rate in MiB / s.\n"
		<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ? ("Note that index array size is not included in the processed size.\n") : (""))
		<< "Note! Test result should only be used as a baseline reference result for buffer.data_upload.* test group results."
		<< tcu::TestLog::EndMessage;
}